

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

ChannelGroupManifest * __thiscall Imf_3_4::IDManifest::add(IDManifest *this,string *channel)

{
  ChannelGroupManifest *this_00;
  ChannelGroupManifest CStack_e8;
  
  ChannelGroupManifest::ChannelGroupManifest(&CStack_e8);
  std::
  vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  ::emplace_back<Imf_3_4::IDManifest::ChannelGroupManifest>(&this->_manifest,&CStack_e8);
  ChannelGroupManifest::~ChannelGroupManifest(&CStack_e8);
  this_00 = (this->_manifest).
            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,channel);
  return this_00;
}

Assistant:

IDManifest::ChannelGroupManifest&
IDManifest::add (const string& channel)
{
    _manifest.push_back (ChannelGroupManifest ());
    ChannelGroupManifest& mfst = _manifest.back ();
    mfst._channels.insert (channel);
    return mfst;
}